

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson.c
# Opt level: O3

bson_t * bson_sized_new(size_t size)

{
  long lVar1;
  _Bool _Var2;
  int iVar3;
  bson_t *pbVar4;
  undefined1 *puVar5;
  undefined4 *puVar6;
  uint32_t *puVar7;
  bson_t *extraout_RAX;
  ulong uVar8;
  void *__dest;
  bson_t *extraout_RAX_00;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  char *__s1;
  long *plVar9;
  undefined7 extraout_var_01;
  bson_t *extraout_RAX_01;
  uint32_t uVar10;
  undefined8 *in_RCX;
  long lVar11;
  bson_iter_t *pbVar12;
  code *extraout_RDX;
  char *first_exclude;
  char *extraout_RDX_00;
  char *first_exclude_00;
  bson_t *in_RSI;
  char *__s2;
  bson_t *dst;
  uint8_t *puVar13;
  size_t num_bytes;
  long *plVar14;
  uint uVar15;
  code *pcVar16;
  byte bVar17;
  __va_list_tag _Stack_458;
  undefined1 auStack_438 [24];
  bson_iter_t *pbStack_420;
  code *pcStack_388;
  undefined1 auStack_378 [72];
  undefined8 uStack_330;
  long *plStack_328;
  long lStack_320;
  bson_t *pbStack_318;
  undefined8 *puStack_310;
  char *pcStack_308;
  bson_iter_t abStack_300 [4];
  __va_list_tag _Stack_160;
  undefined1 auStack_140 [176];
  code *pcStack_90;
  
  bVar17 = 0;
  if (size >> 0x1f == 0) {
    pbVar4 = (bson_t *)bson_malloc(0x80);
    if (size < 0x79) {
      bson_init(pbVar4);
      *(byte *)&pbVar4->flags = (byte)pbVar4->flags & 0xfd;
    }
    else {
      pbVar4->flags = 0;
      pbVar4->len = 5;
      pbVar4->padding[0] = '\0';
      pbVar4->padding[1] = '\0';
      pbVar4->padding[2] = '\0';
      pbVar4->padding[3] = '\0';
      pbVar4->padding[4] = '\0';
      pbVar4->padding[5] = '\0';
      pbVar4->padding[6] = '\0';
      pbVar4->padding[7] = '\0';
      pbVar4->padding[8] = '\0';
      pbVar4->padding[9] = '\0';
      pbVar4->padding[10] = '\0';
      pbVar4->padding[0xb] = '\0';
      *(uint8_t **)(pbVar4->padding + 0x10) = pbVar4->padding + 0x28;
      *(uint8_t **)(pbVar4->padding + 0x18) = pbVar4->padding + 0x30;
      pbVar4->padding[0x20] = '\0';
      pbVar4->padding[0x21] = '\0';
      pbVar4->padding[0x22] = '\0';
      pbVar4->padding[0x23] = '\0';
      pbVar4->padding[0x24] = '\0';
      pbVar4->padding[0x25] = '\0';
      pbVar4->padding[0x26] = '\0';
      pbVar4->padding[0x27] = '\0';
      *(size_t *)(pbVar4->padding + 0x30) = size;
      puVar5 = (undefined1 *)bson_malloc(size);
      *(undefined1 **)(pbVar4->padding + 0x28) = puVar5;
      *puVar5 = 5;
      *(undefined1 *)(*(long *)(pbVar4->padding + 0x28) + 1) = 0;
      *(undefined1 *)(*(long *)(pbVar4->padding + 0x28) + 2) = 0;
      *(undefined1 *)(*(long *)(pbVar4->padding + 0x28) + 3) = 0;
      *(undefined1 *)(*(long *)(pbVar4->padding + 0x28) + 4) = 0;
      *(code **)(pbVar4->padding + 0x38) = bson_realloc_ctx;
      pbVar4->padding[0x40] = '\0';
      pbVar4->padding[0x41] = '\0';
      pbVar4->padding[0x42] = '\0';
      pbVar4->padding[0x43] = '\0';
      pbVar4->padding[0x44] = '\0';
      pbVar4->padding[0x45] = '\0';
      pbVar4->padding[0x46] = '\0';
      pbVar4->padding[0x47] = '\0';
    }
    return pbVar4;
  }
  bson_sized_new_cold_1();
  if ((bson_t *)size != (bson_t *)0x0) {
    if (((in_RSI + -0x1000000 < (bson_t *)0xffffffff80000005) ||
        ((((bson_t *)(size + -0x80))->padding + 0x77)[(long)in_RSI] != '\0')) ||
       ((bson_t *)(ulong)((bson_t *)size)->flags != in_RSI)) {
      pbVar4 = (bson_t *)0x0;
    }
    else {
      pbVar4 = bson_sized_new((size_t)in_RSI);
      if ((pbVar4->flags & 1) == 0) {
        puVar13 = (uint8_t *)
                  (**(long **)(pbVar4->padding + 0x10) + *(long *)(pbVar4->padding + 0x20));
      }
      else {
        puVar13 = pbVar4->padding;
      }
      memcpy(puVar13,(void *)size,(size_t)in_RSI);
      pbVar4->len = (uint32_t)in_RSI;
    }
    return pbVar4;
  }
  bson_new_from_data_cold_1();
  if ((bson_t *)size == (bson_t *)0x0) {
    bson_new_from_buffer_cold_2();
  }
  else if (in_RSI != (bson_t *)0x0) {
    pcVar16 = extraout_RDX;
    if (extraout_RDX == (code *)0x0) {
      pcVar16 = bson_realloc_ctx;
    }
    pbVar4 = (bson_t *)bson_malloc0(0x80);
    puVar7 = *(uint32_t **)size;
    if (puVar7 == (uint32_t *)0x0) {
      in_RSI->flags = 5;
      in_RSI->len = 0;
      puVar6 = (undefined4 *)(*pcVar16)(0,5,in_RCX);
      *(undefined4 **)size = puVar6;
      *puVar6 = 5;
      *(undefined1 *)(*(long *)size + 4) = 0;
      puVar7 = *(uint32_t **)size;
      uVar10 = 5;
    }
    else {
      if (*(long *)in_RSI - 0x80000000U < 0xffffffff80000005) goto LAB_0010d166;
      uVar10 = *puVar7;
    }
    if (*(char *)((long)puVar7 + (ulong)(uVar10 - 1)) == '\0') {
      pbVar4->flags = 0x20;
      pbVar4->len = uVar10;
      *(size_t *)(pbVar4->padding + 0x10) = size;
      *(bson_t **)(pbVar4->padding + 0x18) = in_RSI;
      *(code **)(pbVar4->padding + 0x38) = pcVar16;
      *(undefined8 **)(pbVar4->padding + 0x40) = in_RCX;
      return pbVar4;
    }
LAB_0010d166:
    bson_free(pbVar4);
    return (bson_t *)0x0;
  }
  bson_new_from_buffer_cold_1();
  if ((bson_t *)size != (bson_t *)0x0) {
    if ((((bson_t *)size)->flags & 1) == 0) {
      puVar13 = (uint8_t *)
                (**(long **)(((bson_t *)size)->padding + 0x10) +
                *(long *)(((bson_t *)size)->padding + 0x20));
    }
    else {
      puVar13 = ((bson_t *)size)->padding;
    }
    pbVar4 = bson_new_from_data(puVar13,(ulong)((bson_t *)size)->len);
    return pbVar4;
  }
  bson_copy_cold_1();
  if ((bson_t *)size == (bson_t *)0x0) {
    pcStack_90 = (code *)0x10d2d1;
    bson_copy_to_cold_2();
  }
  else if (in_RSI != (bson_t *)0x0) {
    if ((((bson_t *)size)->flags & 1) != 0) {
      pbVar4 = in_RSI;
      for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
        uVar10 = ((bson_t *)size)->len;
        pbVar4->flags = ((bson_t *)size)->flags;
        pbVar4->len = uVar10;
        size = (size_t)(size + (ulong)bVar17 * -0x10 + 8);
        pbVar4 = (bson_t *)((long)pbVar4 + (ulong)bVar17 * -0x10 + 8);
      }
      in_RSI->flags = 3;
      return extraout_RAX;
    }
    lVar11 = **(long **)(((bson_t *)size)->padding + 0x10);
    lVar1 = *(long *)(((bson_t *)size)->padding + 0x20);
    uVar15 = ((bson_t *)size)->len;
    in_RSI->flags = 2;
    in_RSI->len = uVar15;
    uVar8 = (ulong)uVar15 - 1;
    uVar8 = uVar8 >> 1 | uVar8;
    uVar8 = uVar8 >> 2 | uVar8;
    uVar8 = uVar8 >> 4 | uVar8;
    uVar8 = uVar8 >> 8 | uVar8;
    uVar8 = uVar8 >> 0x10 | uVar8;
    num_bytes = (uVar8 >> 0x20 | uVar8) + 1;
    in_RSI->padding[0] = '\0';
    in_RSI->padding[1] = '\0';
    in_RSI->padding[2] = '\0';
    in_RSI->padding[3] = '\0';
    in_RSI->padding[4] = '\0';
    in_RSI->padding[5] = '\0';
    in_RSI->padding[6] = '\0';
    in_RSI->padding[7] = '\0';
    in_RSI->padding[8] = '\0';
    in_RSI->padding[9] = '\0';
    in_RSI->padding[10] = '\0';
    in_RSI->padding[0xb] = '\0';
    *(uint8_t **)(in_RSI->padding + 0x10) = in_RSI->padding + 0x28;
    *(uint8_t **)(in_RSI->padding + 0x18) = in_RSI->padding + 0x30;
    in_RSI->padding[0x20] = '\0';
    in_RSI->padding[0x21] = '\0';
    in_RSI->padding[0x22] = '\0';
    in_RSI->padding[0x23] = '\0';
    in_RSI->padding[0x24] = '\0';
    in_RSI->padding[0x25] = '\0';
    in_RSI->padding[0x26] = '\0';
    in_RSI->padding[0x27] = '\0';
    pcStack_90 = (code *)0x10d27f;
    __dest = bson_malloc(num_bytes);
    *(void **)(in_RSI->padding + 0x28) = __dest;
    *(size_t *)(in_RSI->padding + 0x30) = num_bytes;
    *(code **)(in_RSI->padding + 0x38) = bson_realloc_ctx;
    in_RSI->padding[0x40] = '\0';
    in_RSI->padding[0x41] = '\0';
    in_RSI->padding[0x42] = '\0';
    in_RSI->padding[0x43] = '\0';
    in_RSI->padding[0x44] = '\0';
    in_RSI->padding[0x45] = '\0';
    in_RSI->padding[0x46] = '\0';
    in_RSI->padding[0x47] = '\0';
    pbVar4 = (bson_t *)memcpy(__dest,(void *)(lVar11 + lVar1),(ulong)((bson_t *)size)->len);
    return pbVar4;
  }
  pcStack_90 = bson_copy_to_excluding;
  bson_copy_to_cold_1();
  if ((bson_t *)size == (bson_t *)0x0) {
    bson_copy_to_excluding_cold_3();
  }
  else if (in_RSI != (bson_t *)0x0) {
    if (first_exclude != (char *)0x0) {
      in_RSI->flags = 3;
      in_RSI->len = 5;
      in_RSI->padding[0] = '\x05';
      in_RSI->padding[1] = '\0';
      in_RSI->padding[2] = '\0';
      in_RSI->padding[3] = '\0';
      in_RSI->padding[4] = '\0';
      _Stack_160.reg_save_area = auStack_140;
      _Stack_160.overflow_arg_area = &stack0xffffffffffffff80;
      _Stack_160.gp_offset = 0x18;
      _Stack_160.fp_offset = 0x30;
      _bson_copy_to_excluding_va((bson_t *)size,in_RSI,first_exclude,&_Stack_160);
      return extraout_RAX_00;
    }
    goto LAB_0010d38a;
  }
  bson_copy_to_excluding_cold_2();
LAB_0010d38a:
  bson_copy_to_excluding_cold_1();
  pcStack_388 = (code *)0x10d3c6;
  pbStack_318 = in_RSI;
  puStack_310 = in_RCX;
  pcStack_308 = extraout_RDX_00;
  _Var2 = bson_iter_init(abStack_300,(bson_t *)size);
  pbVar4 = (bson_t *)CONCAT71(extraout_var,_Var2);
  if (_Var2) {
    pcStack_388 = (code *)0x10d3db;
    _Var2 = bson_iter_next(abStack_300);
    pbVar4 = (bson_t *)CONCAT71(extraout_var_00,_Var2);
    if (_Var2) {
      do {
        pcStack_388 = (code *)0x10d3f6;
        __s1 = bson_iter_key(abStack_300);
        uStack_330 = *puStack_310;
        plStack_328 = (long *)puStack_310[1];
        lVar11 = puStack_310[2];
        __s2 = pcStack_308;
        plVar14 = plStack_328;
        uVar15 = (uint)uStack_330;
        lStack_320 = lVar11;
        do {
          pcStack_388 = (code *)0x10d426;
          iVar3 = strcmp(__s1,__s2);
          if (iVar3 == 0) goto LAB_0010d477;
          if (uVar15 < 0x29) {
            uVar8 = (ulong)uVar15;
            uVar15 = uVar15 + 8;
            uStack_330 = CONCAT44(uStack_330._4_4_,uVar15);
            plVar9 = plVar14;
            plVar14 = (long *)(uVar8 + lVar11);
          }
          else {
            plVar9 = plVar14 + 1;
            plStack_328 = plVar9;
          }
          __s2 = (char *)*plVar14;
          plVar14 = plVar9;
        } while (__s2 != (char *)0x0);
        dst = (bson_t *)0x0;
        pcStack_388 = (code *)0x10d46e;
        pbVar12 = abStack_300;
        pbVar4 = pbStack_318;
        _Var2 = bson_append_iter(pbStack_318,(char *)0x0,0,abStack_300);
        if (!_Var2) {
          pcStack_388 = bson_copy_to_excluding_noinit;
          _bson_copy_to_excluding_va_cold_1();
          pbStack_420 = pbVar12;
          if (pbVar4 == (bson_t *)0x0) {
            bson_copy_to_excluding_noinit_cold_3();
          }
          else if (dst != (bson_t *)0x0) {
            if (first_exclude_00 != (char *)0x0) {
              _Stack_458.reg_save_area = auStack_438;
              _Stack_458.overflow_arg_area = auStack_378;
              _Stack_458.gp_offset = 0x18;
              _Stack_458.fp_offset = 0x30;
              _bson_copy_to_excluding_va(pbVar4,dst,first_exclude_00,&_Stack_458);
              return extraout_RAX_01;
            }
            goto LAB_0010d537;
          }
          bson_copy_to_excluding_noinit_cold_2();
LAB_0010d537:
          uVar10 = (uint32_t)dst;
          bson_copy_to_excluding_noinit_cold_1();
          if (((pbVar4->flags & 0x1c) == 0) && (_Var2 = _bson_grow(pbVar4,uVar10), _Var2)) {
            pbVar4->len = uVar10;
            if ((pbVar4->flags & 1) == 0) {
              pbVar4 = (bson_t *)
                       (**(long **)(pbVar4->padding + 0x10) + *(long *)(pbVar4->padding + 0x20));
            }
            else {
              pbVar4 = (bson_t *)pbVar4->padding;
            }
          }
          else {
            pbVar4 = (bson_t *)0x0;
          }
          return pbVar4;
        }
LAB_0010d477:
        pcStack_388 = (code *)0x10d47f;
        _Var2 = bson_iter_next(abStack_300);
        pbVar4 = (bson_t *)CONCAT71(extraout_var_01,_Var2);
      } while (_Var2);
    }
  }
  return pbVar4;
}

Assistant:

bson_t *
bson_sized_new (size_t size)
{
   bson_impl_alloc_t *impl_a;
   bson_t *b;

   BSON_ASSERT (size <= INT32_MAX);

   b = bson_malloc (sizeof *b);
   impl_a = (bson_impl_alloc_t *) b;

   if (size <= BSON_INLINE_DATA_SIZE) {
      bson_init (b);
      b->flags &= ~BSON_FLAG_STATIC;
   } else {
      impl_a->flags = BSON_FLAG_NONE;
      impl_a->len = 5;
      impl_a->parent = NULL;
      impl_a->depth = 0;
      impl_a->buf = &impl_a->alloc;
      impl_a->buflen = &impl_a->alloclen;
      impl_a->offset = 0;
      impl_a->alloclen = BSON_MAX (5, size);
      impl_a->alloc = bson_malloc (impl_a->alloclen);
      impl_a->alloc[0] = 5;
      impl_a->alloc[1] = 0;
      impl_a->alloc[2] = 0;
      impl_a->alloc[3] = 0;
      impl_a->alloc[4] = 0;
      impl_a->realloc = bson_realloc_ctx;
      impl_a->realloc_func_ctx = NULL;
   }

   return b;
}